

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  
  pIVar3 = GImGui;
  if (((GImGui->DragDropActive == true) &&
      (GImGui->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0)) &&
     (pIVar1 = GImGui->CurrentWindow,
     pIVar1->RootWindow == GImGui->HoveredWindowUnderMovingWindow->RootWindow)) {
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2bfd,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
    }
    bVar4 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (((bVar4) && ((pIVar3->DragDropPayload).SourceId != id)) && (pIVar1->SkipItems == false)) {
      if (pIVar3->DragDropWithinTarget == false) {
        IVar2 = bb->Max;
        (pIVar3->DragDropTargetRect).Min = bb->Min;
        (pIVar3->DragDropTargetRect).Max = IVar2;
        pIVar3->DragDropTargetId = id;
        pIVar3->DragDropWithinTarget = true;
        return true;
      }
      __assert_fail("g.DragDropWithinTarget == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2c03,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}